

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O2

void __thiscall
WavingSketch<8U,_1U,_4U>::WavingSketch(WavingSketch<8U,_1U,_4U> *this,uint32_t _BUCKET_NUM)

{
  uchar *puVar1;
  Bucket *pBVar2;
  clock_t cVar3;
  long lVar4;
  
  Abstract<4U>::Abstract(&this->super_Abstract<4U>);
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00111cc0;
  this->BUCKET_NUM = _BUCKET_NUM;
  this->HASH_NUM = 3;
  this->LENGTH = 0;
  this->cnt = 0;
  pBVar2 = (Bucket *)operator_new__((ulong)_BUCKET_NUM * 0x44);
  if (_BUCKET_NUM != 0) {
    lVar4 = 0;
    do {
      puVar1 = pBVar2->items[0].str + lVar4;
      *(undefined8 *)puVar1 = 0;
      *(undefined8 *)(puVar1 + 8) = 0;
      *(undefined8 *)(puVar1 + 0x10) = 0;
      *(undefined8 *)(puVar1 + 0x18) = 0;
      lVar4 = lVar4 + 0x44;
    } while ((ulong)_BUCKET_NUM * 0x44 - lVar4 != 0);
  }
  this->buckets = pBVar2;
  std::__cxx11::string::assign((char *)&(this->super_Abstract<4U>).name);
  memset(this->buckets,0,(ulong)this->BUCKET_NUM * 0x44);
  Abstract<4U>::rename(&this->super_Abstract<4U>,(char *)0x8,(char *)0x1);
  cVar3 = clock();
  this->seed_choice = (uint32_t)cVar3;
  sleep(1);
  cVar3 = clock();
  this->seed_incast = (uint32_t)cVar3;
  sleep(1);
  cVar3 = clock();
  this->seed_s = (uint32_t)cVar3;
  return;
}

Assistant:

WavingSketch(uint32_t _BUCKET_NUM)
		: BUCKET_NUM(_BUCKET_NUM), HASH_NUM(3),
		cnt(0),
		LENGTH(0) {
		buckets = new Bucket[BUCKET_NUM];
		this->name = (char*)"WavingSketch";
		memset(buckets, 0, BUCKET_NUM * sizeof(Bucket));
		this->rename(int(slot_num), int(counter_num));
		seed_choice = std::clock();
		sleep(1);  // need to sleep for a while, or seed_choice and seed_incast
				   // might get the same seed!
		seed_incast = std::clock();
		sleep(1);  // need to sleep for a while, or seed_incast and seed_s might get
				   // the same seed!
		seed_s = std::clock();
	}